

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

rotations_t *
opengv::relative_pose::fivept_kneip
          (rotations_t *__return_storage_ptr__,RelativeAdapterBase *adapter,
          vector<int,_std::allocator<int>_> *indices)

{
  long lVar1;
  long lVar2;
  long lVar3;
  rotations_t *rotations;
  Matrix<double,_3,_5,_0,_3,_5> f2;
  Matrix<double,_3,_5,_0,_3,_5> f1;
  undefined8 local_138;
  undefined8 auStack_130 [2];
  Matrix<double,_3,_5,_0,_3,_5> local_120;
  Matrix<double,_3,_5,_0,_3,_5> local_a8;
  
  lVar3 = (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 2;
    lVar2 = 4;
    lVar1 = 0;
    do {
      (*adapter->_vptr_RelativeAdapterBase[2])
                (&local_138,adapter,
                 (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar1]);
      *(undefined8 *)
       ((long)local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>.m_storage.m_data
              .array + lVar2 * 4 + -0x10) = local_138;
      *(undefined8 *)
       ((long)local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>.m_storage.m_data
              .array + lVar2 * 4 + -8) = auStack_130[0];
      *(undefined8 *)
       ((long)local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>.m_storage.m_data
              .array + lVar2 * 4) = auStack_130[1];
      (*adapter->_vptr_RelativeAdapterBase[3])
                (&local_138,adapter,
                 (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar1]);
      *(undefined8 *)((long)auStack_130 + lVar2 * 4) = local_138;
      *(undefined8 *)
       ((long)local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>.m_storage.
              m_data.array + lVar2 * 4 + -8) = auStack_130[0];
      *(undefined8 *)
       ((long)local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>.m_storage.
              m_data.array + lVar2 * 4) = auStack_130[1];
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 6;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar1);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  modules::fivept_kneip_main(&local_a8,&local_120,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

opengv::rotations_t
opengv::relative_pose::fivept_kneip(
    const RelativeAdapterBase & adapter,
    const std::vector<int> & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences == 5);

  Eigen::Matrix<double,3,5> f1;
  Eigen::Matrix<double,3,5> f2;

  for(size_t i = 0; i < numberCorrespondences; i++)
  {
    f1.col(i) = adapter.getBearingVector1(indices[i]);
    f2.col(i) = adapter.getBearingVector2(indices[i]);
  }

  rotations_t rotations;
  modules::fivept_kneip_main( f1, f2, rotations );
  return rotations;
}